

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O3

void mark_chests(dw_rom *rom,uint8_t flag)

{
  uint8_t *puVar1;
  dw_chest *pdVar2;
  dungeon_map *pdVar3;
  dungeon_map *pdVar4;
  long lVar5;
  uint8_t uVar6;
  
  pdVar4 = maps;
  lVar5 = 0;
  do {
    uVar6 = pdVar4->index;
    if (uVar6 != '\0') {
      pdVar2 = rom->chests;
      pdVar3 = pdVar4;
      do {
        if (uVar6 == pdVar2[lVar5].map) {
          if (((*(char *)((long)pdVar3 +
                         (ulong)pdVar2[lVar5].x * 0x20 + (ulong)pdVar2[lVar5].x * -2 +
                         (ulong)pdVar2[lVar5].y + 3) == '\f') &&
              (rom->chest_access[lVar5] = rom->chest_access[lVar5] | flag, (flag & 0xf) != 0)) &&
             (pdVar2[lVar5].item == '\x03')) {
            puVar1 = &(rom->map).key_access;
            *puVar1 = *puVar1 | flag;
          }
          break;
        }
        uVar6 = pdVar3[1].index;
        pdVar3 = pdVar3 + 1;
      } while (uVar6 != '\0');
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 0x1f) {
      return;
    }
  } while( true );
}

Assistant:

static void mark_chests(dw_rom *rom, uint8_t flag)
{
    size_t i, x, y;
    dw_chest *chest;
    dungeon_map *map;

    for (i = 0; i < CHEST_COUNT; i++) {
        chest = &rom->chests[i];
        map = get_map(chest->map);
        if (!map)
            continue;
        x = chest->x;
        y = chest->y;
        if (map->tiles[x][y] == (DUNGEON_TILE_CHEST | 8)) {
            rom->chest_access[i] |= flag;
            if (flag & 0xf && chest->item == KEY)
                rom->map.key_access |= flag;
        }
    }
}